

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t sysbvm_integer_negated(sysbvm_context_t *context,sysbvm_tuple_t integer)

{
  _Bool _Var1;
  sysbvm_stuple_t sVar2;
  sysbvm_object_tuple_t *objectTuple;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t integerType;
  sysbvm_tuple_t negatedInteger;
  sysbvm_stuple_t integerValue;
  sysbvm_tuple_t integer_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isImmediate(integer);
  if (_Var1) {
    sVar2 = sysbvm_tuple_integer_decodeSmall(integer);
    context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeInt64(context,-sVar2);
  }
  else {
    objectTuple = (sysbvm_object_tuple_t *)sysbvm_context_shallowCopy(context,integer);
    sVar3 = sysbvm_tuple_getType(context,(sysbvm_tuple_t)objectTuple);
    if (sVar3 == (context->roots).largePositiveIntegerType) {
      local_48 = (context->roots).largeNegativeIntegerType;
    }
    else {
      local_48 = (context->roots).largePositiveIntegerType;
    }
    sysbvm_tuple_setType(objectTuple,local_48);
    context_local =
         (sysbvm_context_t *)sysbvm_integer_normalize(context,(sysbvm_integer_t *)objectTuple);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_negated(sysbvm_context_t *context, sysbvm_tuple_t integer)
{
    if(sysbvm_tuple_isImmediate(integer))
    {
        sysbvm_stuple_t integerValue = sysbvm_tuple_integer_decodeSmall(integer);
        return sysbvm_tuple_integer_encodeInt64(context, -integerValue);
    }

    // Shallow copy and swap the integer type.
    sysbvm_tuple_t negatedInteger = sysbvm_context_shallowCopy(context, integer);
    sysbvm_tuple_t integerType = sysbvm_tuple_getType(context, negatedInteger);
    sysbvm_tuple_setType(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(negatedInteger), integerType == context->roots.largePositiveIntegerType ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType);
    return sysbvm_integer_normalize(context, (sysbvm_integer_t*)negatedInteger);
}